

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

Code * __thiscall
md::Code::or_to_dx(Code *this,Param *param,DataRegister *reg,Size size,bool param_minus_reg)

{
  short sVar1;
  short sVar2;
  uint16_t uVar3;
  int iVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  uint16_t local_2c;
  short local_2a;
  short local_28;
  undefined1 local_25;
  uint16_t opcode;
  uint16_t param_minus_reg_mask;
  uint16_t size_code;
  bool param_minus_reg_local;
  Size size_local;
  DataRegister *reg_local;
  Param *param_local;
  Code *this_local;
  
  local_28 = 0;
  if (size == WORD) {
    local_28 = 1;
  }
  else if (size == LONG) {
    local_28 = 2;
  }
  local_2a = (param_minus_reg & 1) << 8;
  local_25 = param_minus_reg;
  _opcode = size;
  _size_code = reg;
  reg_local = (DataRegister *)param;
  param_local = (Param *)this;
  iVar4 = (**(reg->super_Register).super_Param._vptr_Param)();
  sVar1 = (short)iVar4 * 0x200 + local_2a;
  sVar2 = local_28 * 0x40;
  uVar3 = Param::getMXn((Param *)reg_local);
  local_2c = uVar3 + 0x8000 + sVar1 + sVar2;
  add_opcode(this,local_2c);
  (*(reg_local->super_Register).super_Param._vptr_Param[2])();
  add_bytes(this,&local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_48);
  return this;
}

Assistant:

Code& Code::or_to_dx(const Param& param, const DataRegister& reg, Size size, bool param_minus_reg)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t param_minus_reg_mask = ((param_minus_reg) ? 1 : 0) << 8;

    uint16_t opcode = 0x8000 + (reg.getXn() << 9) + param_minus_reg_mask + (size_code << 6) + param.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(param.getAdditionnalData());

    return *this;
}